

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.hpp
# Opt level: O2

void __thiscall baryonyx::problem::problem(problem *this,raw_problem *pb)

{
  problem_solver_type pVar1;
  
  std::__shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2> *)pb);
  objective_function::objective_function(&this->objective,&pb->objective);
  std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::vector
            (&this->equal_constraints,&pb->equal_constraints);
  std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::vector
            (&this->greater_constraints,&pb->greater_constraints);
  std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::vector
            (&this->less_constraints,&pb->less_constraints);
  baryonyx::variables::variables(&this->vars,&pb->vars);
  (this->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->affected_vars).values.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->affected_vars).values.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->affected_vars).values.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->affected_vars).values.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  this->type = pb->type;
  this->problem_type = equalities_01;
  pVar1 = which_problem_type(this);
  this->problem_type = pVar1;
  return;
}

Assistant:

problem(const raw_problem& pb)
      : strings(pb.strings)
      , objective(pb.objective)
      , equal_constraints(pb.equal_constraints)
      , greater_constraints(pb.greater_constraints)
      , less_constraints(pb.less_constraints)
      , vars(pb.vars)
      , type(pb.type)
    {
        problem_type = which_problem_type();
    }